

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testEXE.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  bool bVar1;
  App *pAVar2;
  ostream *poVar3;
  reference pbVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *aarg;
  iterator __end1;
  iterator __begin1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  ParseError *e;
  string local_480;
  allocator local_459;
  string local_458;
  App *local_438;
  App *subcom;
  string local_428;
  allocator local_401;
  string local_400;
  allocator local_3d9;
  string local_3d8;
  allocator local_3a1;
  string local_3a0;
  undefined1 local_380 [8];
  App app;
  int value;
  char **argv_local;
  int argc_local;
  
  app.config_formatter_.super___shared_ptr<CLI::Config,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi._4_4_ = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_3a0,"Test App",&local_3a1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_3d8,"",&local_3d9);
  CLI::App::App((App *)local_380,&local_3a0,&local_3d8);
  std::__cxx11::string::~string((string *)&local_3d8);
  std::allocator<char>::~allocator((allocator<char> *)&local_3d9);
  std::__cxx11::string::~string((string *)&local_3a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_3a1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_400,"-v",&local_401);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_428,"value",(allocator *)((long)&subcom + 7));
  CLI::App::add_option<int,_int,_(CLI::detail::enabler)0>
            ((App *)local_380,&local_400,
             (int *)((long)&app.config_formatter_.
                            super___shared_ptr<CLI::Config,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                            _M_pi + 4),&local_428);
  std::__cxx11::string::~string((string *)&local_428);
  std::allocator<char>::~allocator((allocator<char> *)((long)&subcom + 7));
  std::__cxx11::string::~string((string *)&local_400);
  std::allocator<char>::~allocator((allocator<char> *)&local_401);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_458,"sub",&local_459);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_480,"",(allocator *)((long)&e + 7));
  pAVar2 = CLI::App::add_subcommand((App *)local_380,&local_458,&local_480);
  pAVar2 = CLI::App::prefix_command(pAVar2,true);
  std::__cxx11::string::~string((string *)&local_480);
  std::allocator<char>::~allocator((allocator<char> *)((long)&e + 7));
  std::__cxx11::string::~string((string *)&local_458);
  std::allocator<char>::~allocator((allocator<char> *)&local_459);
  local_438 = pAVar2;
  CLI::App::parse((App *)local_380,argc,argv);
  poVar3 = std::operator<<((ostream *)&std::cout,"value =");
  poVar3 = (ostream *)
           std::ostream::operator<<
                     (poVar3,app.config_formatter_.
                             super___shared_ptr<CLI::Config,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                             ._M_pi._4_4_);
  std::operator<<(poVar3,'\n');
  std::operator<<((ostream *)&std::cout,"after Args:");
  CLI::App::remaining_abi_cxx11_
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&__begin1,local_438,false);
  __end1 = CLI::std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&__begin1);
  aarg = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         CLI::std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&__begin1);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)&aarg);
    if (!bVar1) break;
    pbVar4 = __gnu_cxx::
             __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator*(&__end1);
    poVar3 = std::operator<<((ostream *)&std::cout,(string *)pbVar4);
    std::operator<<(poVar3," ");
    __gnu_cxx::
    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&__end1);
  }
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&__begin1);
  std::operator<<((ostream *)&std::cout,'\n');
  CLI::App::~App((App *)local_380);
  return 0;
}

Assistant:

int main(int argc, const char *argv[]) {

    int value{0};
    CLI::App app{"Test App"};
    app.add_option("-v", value, "value");

    auto *subcom = app.add_subcommand("sub", "")->prefix_command();
    CLI11_PARSE(app, argc, argv);

    std::cout << "value =" << value << '\n';
    std::cout << "after Args:";
    for(const auto &aarg : subcom->remaining()) {
        std::cout << aarg << " ";
    }
    std::cout << '\n';
}